

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall DifferingTypesTest::typePromotionTest(DifferingTypesTest *this)

{
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  value_type vVar6;
  value_type vVar7;
  size_t sVar8;
  byte *pbVar9;
  BinaryViewExpressionScalarFirst<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_int,_andres::marray_detail::Times<int,_unsigned_char,_int>_>
  BVar10;
  BinaryViewExpressionScalarSecond<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_int,_andres::marray_detail::Times<unsigned_char,_int,_int>_>
  BVar11;
  undefined1 uStack_1b4;
  int local_1ac;
  undefined5 local_1a8;
  undefined3 local_1a3;
  undefined5 uStack_1a0;
  bool local_191;
  undefined5 local_190;
  undefined3 uStack_18b;
  scalar_type_conflict local_188;
  undefined1 uStack_184;
  int local_17c;
  undefined5 local_178;
  undefined3 local_173;
  undefined5 uStack_170;
  bool local_161;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Minus<int,_unsigned_char,_int>_>
  local_160;
  bool local_141;
  BinaryViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::marray_detail::Plus<int,_unsigned_char,_int>_>
  local_140;
  bool local_121;
  BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<unsigned_char,_int,_int>_>
  local_120;
  bool local_101;
  BinaryViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Plus<unsigned_char,_int,_int>_>
  local_100;
  bool local_e1;
  ulong local_e0;
  size_t j;
  undefined1 local_d0 [8];
  Marray<int,_std::allocator<unsigned_long>_> b;
  allocator<unsigned_char> local_72;
  uchar local_71;
  undefined1 local_70 [8];
  Marray<unsigned_char,_std::allocator<unsigned_long>_> a;
  size_t shape [2];
  DifferingTypesTest *this_local;
  
  a._64_8_ = 3;
  shape[0] = 4;
  local_71 = 0xfa;
  std::allocator<unsigned_char>::allocator(&local_72);
  andres::Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<unsigned_char,std::allocator<unsigned_long>> *)local_70,
             (unsigned_long *)&a.field_0x40,shape + 1,&local_71,&andres::defaultOrder,&local_72);
  std::allocator<unsigned_char>::~allocator(&local_72);
  j._4_4_ = 1000;
  std::allocator<int>::allocator((allocator<int> *)((long)&j + 3));
  andres::Marray<int,std::allocator<unsigned_long>>::Marray<unsigned_long*>
            ((Marray<int,std::allocator<unsigned_long>> *)local_d0,(unsigned_long *)&a.field_0x40,
             shape + 1,(int *)((long)&j + 4),&andres::defaultOrder,(allocator<int> *)((long)&j + 3))
  ;
  std::allocator<int>::~allocator((allocator<int> *)((long)&j + 3));
  local_e0 = 0;
  while( true ) {
    uVar1 = local_e0;
    sVar8 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::size
                      ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70);
    if (sVar8 <= uVar1) break;
    andres::operator+(&local_100,
                      (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                       *)local_70,
                      (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_d0);
    vVar2 = andres::
            BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<unsigned_char,int,int>>
            ::operator()((BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<unsigned_char,int,int>>
                          *)&local_100,local_e0);
    local_e1 = vVar2 == 0x4e2;
    test(&local_e1);
    andres::operator-(&local_120,
                      (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                       *)local_70,
                      (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_d0);
    vVar3 = andres::
            BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Minus<unsigned_char,int,int>>
            ::operator()((BinaryViewExpression<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::View<int,false,std::allocator<unsigned_long>>,int,andres::marray_detail::Minus<unsigned_char,int,int>>
                          *)&local_120,local_e0);
    local_101 = vVar3 == -0x2ee;
    test(&local_101);
    andres::operator+(&local_140,
                      (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_d0,
                      (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                       *)local_70);
    vVar4 = andres::
            BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Plus<int,unsigned_char,int>>
            ::operator()((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Plus<int,unsigned_char,int>>
                          *)&local_140,local_e0);
    local_121 = vVar4 == 0x4e2;
    test(&local_121);
    andres::operator-(&local_160,
                      (ViewExpression<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int>
                       *)local_d0,
                      (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                       *)local_70);
    vVar5 = andres::
            BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Minus<int,unsigned_char,int>>
            ::operator()((BinaryViewExpression<andres::View<int,false,std::allocator<unsigned_long>>,int,andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,andres::marray_detail::Minus<int,unsigned_char,int>>
                          *)&local_160,local_e0);
    local_141 = vVar5 == 0x2ee;
    test(&local_141);
    local_17c = 4;
    BVar10 = andres::operator*(&local_17c,
                               (ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                                *)local_70);
    local_188 = BVar10.scalar_;
    local_190 = BVar10.e_._0_5_;
    uStack_18b = BVar10.e_._5_3_;
    uStack_170 = (undefined5)(CONCAT17(uStack_184,BVar10._5_7_) >> 0x18);
    local_178 = local_190;
    local_173 = uStack_18b;
    vVar6 = andres::
            BinaryViewExpressionScalarFirst<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<int,unsigned_char,int>>
            ::operator()((BinaryViewExpressionScalarFirst<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<int,unsigned_char,int>>
                          *)&local_178,local_e0);
    pbVar9 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70,
                        local_e0);
    local_161 = vVar6 == (uint)*pbVar9 * 4;
    test(&local_161);
    local_1ac = 4;
    BVar11 = andres::operator*((ViewExpression<andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>,_unsigned_char>
                                *)local_70,&local_1ac);
    uStack_1a0 = (undefined5)(CONCAT17(uStack_1b4,BVar11._5_7_) >> 0x18);
    local_1a8 = BVar11.e_._0_5_;
    local_1a3 = BVar11.e_._5_3_;
    vVar7 = andres::
            BinaryViewExpressionScalarSecond<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<unsigned_char,int,int>>
            ::operator()((BinaryViewExpressionScalarSecond<andres::View<unsigned_char,false,std::allocator<unsigned_long>>,unsigned_char,int,andres::marray_detail::Times<unsigned_char,int,int>>
                          *)&local_1a8,local_e0);
    pbVar9 = andres::View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator()
                       ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)local_70,
                        local_e0);
    local_191 = vVar7 == (uint)*pbVar9 * 4;
    test(&local_191);
    local_e0 = local_e0 + 1;
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_d0);
  andres::Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)local_70);
  return;
}

Assistant:

void DifferingTypesTest::typePromotionTest()
{
    std::size_t shape[] = {3, 4};
    andres::Marray<unsigned char> a(shape, shape + 2, 250);
    andres::Marray<int> b(shape, shape + 2, 1000);
    for(std::size_t j=0; j<a.size(); ++j) {
        test((a + b)(j) == 1250);
        test((a - b)(j) == -750);
        test((b + a)(j) == 1250);
        test((b - a)(j) == 750);
        test((4 * a)(j) == 4 * a(j));
        test((a * 4)(j) == a(j) * 4);
    }
}